

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_Parser.H
# Opt level: O0

ParserExecutor<3> __thiscall amrex::Parser::compileHost<3>(Parser *this)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  size_t sVar4;
  Arena *pAVar5;
  undefined4 extraout_var;
  amrex_parser *in_RDI;
  runtime_error *e;
  int stack_size;
  string *in_stack_fffffffffffffe28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe30;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe38;
  string *in_stack_fffffffffffffe68;
  amrex_parser *parser;
  undefined4 in_stack_fffffffffffffe78;
  undefined4 in_stack_fffffffffffffe7c;
  string local_e8 [32];
  string local_c8 [48];
  string local_98 [32];
  string local_78 [32];
  string local_58 [32];
  string local_38 [36];
  int local_14;
  char *local_8;
  
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)in_RDI);
  if ((bVar1) &&
     (peVar3 = std::
               __shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x14830f4), peVar3->m_parser != (amrex_parser *)0x0)) {
    peVar3 = std::__shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1483109);
    if (peVar3->m_host_executor == (char *)0x0) {
      peVar3 = std::
               __shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x148311e);
      parser = peVar3->m_parser;
      std::__shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1483131);
      sVar4 = parser_exe_size(in_RDI,(int *)CONCAT44(in_stack_fffffffffffffe7c,
                                                     in_stack_fffffffffffffe78),(int *)parser);
      iVar2 = (int)sVar4;
      peVar3 = std::
               __shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1483158);
      peVar3->m_exe_size = iVar2;
      peVar3 = std::
               __shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1483169);
      if (0x10 < peVar3->m_max_stack_size) {
        in_stack_fffffffffffffe68 = local_98;
        std::__cxx11::to_string(iVar2);
        std::operator+((char *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
        std::operator+(in_stack_fffffffffffffe38,(char *)in_stack_fffffffffffffe30);
        std::__shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x14831cd);
        std::operator+(in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
        Abort(in_stack_fffffffffffffe28);
        std::__cxx11::string::~string(local_38);
        std::__cxx11::string::~string(local_58);
        std::__cxx11::string::~string(local_78);
        std::__cxx11::string::~string(local_98);
      }
      if (local_14 != 0) {
        std::__cxx11::to_string(iVar2);
        std::operator+((char *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
        Abort(in_stack_fffffffffffffe28);
        std::__cxx11::string::~string(local_c8);
        std::__cxx11::string::~string(local_e8);
      }
      pAVar5 = The_Pinned_Arena();
      peVar3 = std::
               __shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1483388);
      iVar2 = (*pAVar5->_vptr_Arena[2])(pAVar5,(long)peVar3->m_exe_size);
      peVar3 = std::
               __shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x14833a9);
      peVar3->m_host_executor = (char *)CONCAT44(extraout_var,iVar2);
      std::__shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x14833bc);
      std::__shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x14833cf);
      parser_compile(parser,(char *)in_stack_fffffffffffffe68);
    }
    peVar3 = std::__shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<amrex::Parser::Data,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x14835d5);
    local_8 = peVar3->m_host_executor;
  }
  else {
    local_8 = (char *)0x0;
  }
  return (ParserExecutor<3>)local_8;
}

Assistant:

ParserExecutor<N>
Parser::compileHost () const
{
    if (m_data && m_data->m_parser) {
        AMREX_ASSERT(N == m_data->m_nvars);

        if (!(m_data->m_host_executor)) {
            int stack_size;
            m_data->m_exe_size = parser_exe_size(m_data->m_parser, m_data->m_max_stack_size,
                                                 stack_size);

            if (m_data->m_max_stack_size > AMREX_PARSER_STACK_SIZE) {
                amrex::Abort("amrex::Parser: AMREX_PARSER_STACK_SIZE, "
                             + std::to_string(AMREX_PARSER_STACK_SIZE) + ", is too small for "
                             + m_data->m_expression);
            }
            if (stack_size != 0) {
                amrex::Abort("amrex::Parser: something went wrong with parser stack! "
                             + std::to_string(stack_size));
            }

            m_data->m_host_executor = (char*)The_Pinned_Arena()->alloc(m_data->m_exe_size);

            try {
                parser_compile(m_data->m_parser, m_data->m_host_executor);
            } catch (const std::runtime_error& e) {
                throw std::runtime_error(std::string(e.what()) + " in Parser expression \""
                                         + m_data->m_expression + "\"");
            }
        }

#ifdef AMREX_USE_GPU
        return ParserExecutor<N>{m_data->m_host_executor, m_data->m_device_executor};
#else
        return ParserExecutor<N>{m_data->m_host_executor};
#endif
    } else {
        return ParserExecutor<N>{};
    }
}